

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# primitive_dictionary.hpp
# Opt level: O3

primitive_dictionary_entry_t * __thiscall
duckdb::
PrimitiveDictionary<duckdb::interval_t,_duckdb::ParquetIntervalTargetType,_duckdb::ParquetIntervalOperator>
::Lookup(PrimitiveDictionary<duckdb::interval_t,_duckdb::ParquetIntervalTargetType,_duckdb::ParquetIntervalOperator>
         *this,interval_t *value)

{
  int iVar1;
  int iVar2;
  long lVar3;
  long lVar4;
  hash_t hVar5;
  ulong uVar6;
  int64_t in_RDX;
  primitive_dictionary_entry_t *ppVar7;
  long lVar8;
  long lVar9;
  interval_t val;
  
  val.micros = in_RDX;
  val._0_8_ = value->micros;
  hVar5 = Hash<duckdb::interval_t>(*(duckdb **)value,val);
  uVar6 = hVar5 & this->capacity_mask;
  ppVar7 = this->dictionary + uVar6;
  if (ppVar7->index != 0xffffffff) {
    lVar3 = value->micros;
    lVar8 = lVar3 / 86400000000 + (long)value->days;
    do {
      iVar1 = (ppVar7->value).months;
      iVar2 = (ppVar7->value).days;
      lVar4 = (ppVar7->value).micros;
      if ((iVar2 == value->days && iVar1 == value->months) && lVar4 == lVar3) {
        return ppVar7;
      }
      lVar9 = (long)iVar2 + lVar4 / 86400000000;
      if ((((long)iVar1 + lVar9 / 0x1e == lVar8 / 0x1e + (long)value->months) &&
          (lVar9 % 0x1e == lVar8 % 0x1e)) && (lVar4 % 86400000000 == lVar3 % 86400000000)) {
        return ppVar7;
      }
      uVar6 = uVar6 + 1 & this->capacity_mask;
      ppVar7 = this->dictionary + uVar6;
    } while (ppVar7->index != 0xffffffff);
  }
  return ppVar7;
}

Assistant:

primitive_dictionary_entry_t &Lookup(const SRC &value) const {
		auto offset = Hash(value) & capacity_mask;
		while (!dictionary[offset].IsEmpty() && dictionary[offset].value != value) {
			++offset &= capacity_mask;
		}
		return dictionary[offset];
	}